

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_FACopyDescriptor.H
# Opt level: O0

FabArrayId __thiscall
amrex::FabArrayCopyDescriptor<amrex::FArrayBox>::RegisterFabArray
          (FabArrayCopyDescriptor<amrex::FArrayBox> *this,FabArray<amrex::FArrayBox> *fabarray)

{
  size_type sVar1;
  vector<amrex::FabArray<amrex::FArrayBox>_*,_std::allocator<amrex::FabArray<amrex::FArrayBox>_*>_>
  *in_RDI;
  FabArrayId result;
  value_type *in_stack_ffffffffffffff88;
  value_type *in_stack_ffffffffffffff98;
  vector<amrex::FabArray<amrex::FArrayBox>_*,_std::allocator<amrex::FabArray<amrex::FArrayBox>_*>_>
  *in_stack_ffffffffffffffa0;
  FabArrayId local_4;
  
  sVar1 = std::
          vector<amrex::FabArray<amrex::FArrayBox>_*,_std::allocator<amrex::FabArray<amrex::FArrayBox>_*>_>
          ::size(in_RDI);
  FabArrayId::FabArrayId(&local_4,(int)sVar1);
  std::
  vector<amrex::FabArray<amrex::FArrayBox>_*,_std::allocator<amrex::FabArray<amrex::FArrayBox>_*>_>
  ::push_back(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
  std::
  multimap<int,_amrex::FabCopyDescriptor<amrex::FArrayBox>_*,_std::less<int>,_std::allocator<std::pair<const_int,_amrex::FabCopyDescriptor<amrex::FArrayBox>_*>_>_>
  ::multimap((multimap<int,_amrex::FabCopyDescriptor<amrex::FArrayBox>_*,_std::less<int>,_std::allocator<std::pair<const_int,_amrex::FabCopyDescriptor<amrex::FArrayBox>_*>_>_>
              *)0x8535d7);
  std::
  vector<std::multimap<int,_amrex::FabCopyDescriptor<amrex::FArrayBox>_*,_std::less<int>,_std::allocator<std::pair<const_int,_amrex::FabCopyDescriptor<amrex::FArrayBox>_*>_>_>,_std::allocator<std::multimap<int,_amrex::FabCopyDescriptor<amrex::FArrayBox>_*,_std::less<int>,_std::allocator<std::pair<const_int,_amrex::FabCopyDescriptor<amrex::FArrayBox>_*>_>_>_>_>
  ::push_back((vector<std::multimap<int,_amrex::FabCopyDescriptor<amrex::FArrayBox>_*,_std::less<int>,_std::allocator<std::pair<const_int,_amrex::FabCopyDescriptor<amrex::FArrayBox>_*>_>_>,_std::allocator<std::multimap<int,_amrex::FabCopyDescriptor<amrex::FArrayBox>_*,_std::less<int>,_std::allocator<std::pair<const_int,_amrex::FabCopyDescriptor<amrex::FArrayBox>_*>_>_>_>_>
               *)in_RDI,in_stack_ffffffffffffff88);
  std::
  multimap<int,_amrex::FabCopyDescriptor<amrex::FArrayBox>_*,_std::less<int>,_std::allocator<std::pair<const_int,_amrex::FabCopyDescriptor<amrex::FArrayBox>_*>_>_>
  ::~multimap((multimap<int,_amrex::FabCopyDescriptor<amrex::FArrayBox>_*,_std::less<int>,_std::allocator<std::pair<const_int,_amrex::FabCopyDescriptor<amrex::FArrayBox>_*>_>_>
               *)0x8535f2);
  return (FabArrayId)local_4.fabArrayId;
}

Assistant:

FabArrayId
FabArrayCopyDescriptor<FAB>::RegisterFabArray(FabArray<FAB>* fabarray)
{
    BL_ASSERT(fabArrays.size() == fabCopyDescList.size());

    FabArrayId result(fabArrays.size());

    fabArrays.push_back(fabarray);  /* Bump size() by one */

    fabCopyDescList.push_back(FCDMap());

    return result;
}